

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_emulator_custom_command_arg.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *substring_custom_argument;
  char *substring_success;
  char **argv_local;
  int argc_local;
  
  if (((1 < argc) && (pcVar1 = strstr(argv[1],"custom_argument"), pcVar1 != (char *)0x0)) &&
     (pcVar1 = strstr(argv[2],"/generated_exe_emulator_expected"), pcVar1 != (char *)0x0)) {
    return 0;
  }
  return 1;
}

Assistant:

int main(int argc, const char* argv[])
{
  // Require a slash to make sure it is a path and not a target name.
  const char* substring_success = "/generated_exe_emulator_expected";
  const char* substring_custom_argument = "custom_argument";

  if (argc < 2) {
    return EXIT_FAILURE;
  }
  if (strstr(argv[1], substring_custom_argument) != 0 &&
      strstr(argv[2], substring_success) != 0) {
    return EXIT_SUCCESS;
  }
  return EXIT_FAILURE;
}